

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txoutproof.cpp
# Opt level: O1

void RegisterTxoutProofRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  long *local_48 [2];
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterTxoutProofRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterTxoutProofRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"blockchain","");
      category._M_string_length = in_stack_ffffffffffffffa0;
      category._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff98;
      category.field_2._M_allocated_capacity = in_stack_ffffffffffffffa8;
      category.field_2._8_8_ = in_stack_ffffffffffffffb0;
      CRPCCommand::CRPCCommand
                (RegisterTxoutProofRPCCommands::commands,category,(RpcMethodFnType)local_48);
      puVar3 = &stack0xffffffffffffffa8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff98,"blockchain","");
      category_00._M_string_length = in_stack_ffffffffffffffa0;
      category_00._M_dataplus._M_p = puVar3;
      category_00.field_2._M_allocated_capacity = in_stack_ffffffffffffffa8;
      category_00.field_2._8_8_ = in_stack_ffffffffffffffb0;
      CRPCCommand::CRPCCommand
                (RegisterTxoutProofRPCCommands::commands + 1,category_00,
                 (RpcMethodFnType)&stack0xffffffffffffff98);
      if (puVar3 != &stack0xffffffffffffffa8) {
        operator_delete(puVar3,in_stack_ffffffffffffffa8 + 1);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterTxoutProofRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0x100;
  pcmd = RegisterTxoutProofRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterTxoutProofRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"blockchain", &gettxoutproof},
        {"blockchain", &verifytxoutproof},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}